

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall CVmHandleManager::alloc_handle(CVmHandleManager *this,void *item)

{
  void *pvVar1;
  undefined8 in_RSI;
  long in_RDI;
  size_t i;
  size_t slot;
  ulong local_20;
  ulong local_18;
  
  for (local_18 = 0;
      (local_18 < *(ulong *)(in_RDI + 0x10) &&
      (*(long *)(*(long *)(in_RDI + 8) + local_18 * 8) != 0)); local_18 = local_18 + 1) {
  }
  if (local_18 == *(ulong *)(in_RDI + 0x10)) {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 0x20;
    pvVar1 = realloc(*(void **)(in_RDI + 8),*(long *)(in_RDI + 0x10) << 3);
    *(void **)(in_RDI + 8) = pvVar1;
    for (local_20 = local_18; local_20 < *(ulong *)(in_RDI + 0x10); local_20 = local_20 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 8) + local_20 * 8) = 0;
    }
  }
  *(undefined8 *)(*(long *)(in_RDI + 8) + local_18 * 8) = in_RSI;
  return (int)local_18 + 1;
}

Assistant:

int CVmHandleManager::alloc_handle(void *item)
{
    size_t slot;

    /* scan for a free slot */
    for (slot = 0 ; slot < handles_max_ ; ++slot)
    {
        /* if this one is free, use it */
        if (handles_[slot] == 0)
            break;
    }

    /* if we didn't find a free slot, extend the array */
    if (slot == handles_max_)
    {
        size_t i;

        /* allocate a larger array */
        handles_max_ += 32;
        handles_ = (void **)
                   t3realloc(handles_, handles_max_ * sizeof(*handles_));

        /* clear out the newly-allocated slots */
        for (i = slot ; i < handles_max_ ; ++i)
            handles_[i] = 0;
    }

    /* store the new item in our pointer array */
    handles_[slot] = item;

    /* 
     *   convert the slot number to a handle by adjusting it to a 1-based
     *   index, and return the result 
     */
    return slot + 1;
}